

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut_pex.cpp
# Opt level: O0

bool __thiscall
libtorrent::anon_unknown_6::ut_pex_peer_plugin::on_extended
          (ut_pex_peer_plugin *this,int length,int msg,span<const_char> body)

{
  address *__return_storage_ptr__;
  peer_connection *ppVar1;
  bool bVar2;
  type_t tVar3;
  int iVar4;
  int iVar5;
  index_type iVar6;
  char *start;
  char *end;
  undefined4 extraout_var;
  reference ppVar7;
  undefined4 extraout_var_00;
  size_type sVar8;
  session_settings *psVar9;
  reference ppVar10;
  counters *this_00;
  char **extraout_RDX;
  char **extraout_RDX_00;
  char **extraout_RDX_01;
  char **extraout_RDX_02;
  char **extraout_RDX_03;
  char **extraout_RDX_04;
  char **extraout_RDX_05;
  char **extraout_RDX_06;
  char **extraout_RDX_07;
  char **extraout_RDX_08;
  char **extraout_RDX_09;
  char **extraout_RDX_10;
  char **extraout_RDX_11;
  char **extraout_RDX_12;
  char **extraout_RDX_13;
  char **extraout_RDX_14;
  char **extraout_RDX_15;
  char **extraout_RDX_16;
  char **extraout_RDX_17;
  char **extraout_RDX_18;
  char **ppcVar11;
  peers4_t *ppVar12;
  peers6_t *ppVar13;
  bool local_869;
  byte local_821;
  bool local_7d1;
  bool local_791;
  byte local_759;
  bool local_6f1;
  const_iterator local_668;
  __normal_iterator<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>_*,_std::vector<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>_>_>_>
  local_660;
  pair<std::array<unsigned_char,_16UL>,_unsigned_short> *local_658;
  __normal_iterator<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>_*,_std::vector<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>_>_>_>
  local_650;
  __normal_iterator<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>_*,_std::vector<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>_>_>_>
  local_648;
  __normal_iterator<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>_*,_std::vector<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>_>_>_>
  j_3;
  address local_638;
  address_v6 local_618;
  array<unsigned_char,_16UL> local_5fa;
  undefined1 local_5ea [8];
  value_type v_3;
  address local_5b8;
  uchar local_592;
  pex_flags_t local_591;
  undefined1 local_590 [7];
  pex_flags_t flags_1;
  basic_endpoint<boost::asio::ip::tcp> adr_3;
  int i_4;
  char *fin_1;
  char *in_3;
  undefined1 auStack_558 [4];
  int num_peers_3;
  undefined1 local_548 [8];
  bdecode_node p6f;
  bdecode_node local_4f8;
  pair<std::array<unsigned_char,_16UL>,_unsigned_short> *local_4b8;
  const_iterator local_4b0;
  __normal_iterator<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>_*,_std::vector<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>_>_>_>
  local_4a8;
  pair<std::array<unsigned_char,_16UL>,_unsigned_short> *local_4a0;
  __normal_iterator<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>_*,_std::vector<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>_>_>_>
  local_498;
  __normal_iterator<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>_*,_std::vector<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>_>_>_>
  local_490;
  __normal_iterator<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>_*,_std::vector<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>_>_>_>
  j_2;
  address local_480;
  address_v6 local_460;
  array<unsigned_char,_16UL> local_442;
  undefined1 local_432 [8];
  value_type v_2;
  basic_endpoint<boost::asio::ip::tcp> adr_2;
  int i_3;
  char *in_2;
  undefined1 auStack_3f0 [4];
  int num_peers_2;
  undefined1 local_3e0 [8];
  bdecode_node p6;
  const_iterator local_390;
  __normal_iterator<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>_*,_std::vector<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>_>_>_>
  local_388;
  pair<std::array<unsigned_char,_4UL>,_unsigned_short> *local_380;
  __normal_iterator<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>_*,_std::vector<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>_>_>_>
  local_378;
  __normal_iterator<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>_*,_std::vector<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>_>_>_>
  local_370;
  __normal_iterator<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>_*,_std::vector<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>_>_>_>
  j_1;
  address local_360;
  undefined1 local_340 [16];
  undefined1 local_330 [2];
  value_type v_1;
  address local_310;
  uchar local_2ea;
  pex_flags_t local_2e9;
  undefined1 local_2e8 [7];
  pex_flags_t flags;
  basic_endpoint<boost::asio::ip::tcp> adr_1;
  int i_2;
  char *fin;
  char *in_1;
  int num_peers_1;
  bool peers_added;
  undefined1 local_2a0 [8];
  bdecode_node pf;
  bdecode_node local_250;
  pair<std::array<unsigned_char,_4UL>,_unsigned_short> *local_210;
  const_iterator local_208;
  __normal_iterator<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>_*,_std::vector<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>_>_>_>
  local_200;
  pair<std::array<unsigned_char,_4UL>,_unsigned_short> *local_1f8;
  __normal_iterator<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>_*,_std::vector<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>_>_>_>
  local_1f0;
  __normal_iterator<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>_*,_std::vector<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>_>_>_>
  local_1e8;
  __normal_iterator<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>_*,_std::vector<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>_>_>_>
  j;
  address local_1d8;
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [2];
  value_type v;
  basic_endpoint<boost::asio::ip::tcp> adr;
  int i_1;
  char *in;
  uint local_178;
  int num_peers;
  int num_added;
  int num_dropped;
  undefined1 local_160 [8];
  bdecode_node p;
  error_code local_118 [2];
  int local_f4;
  undefined1 local_f0 [4];
  int ret;
  error_code ec;
  bdecode_node pex_msg;
  int i;
  int num_pex_timers;
  int local_7c;
  duration<long,_std::ratio<1L,_1L>_> local_78;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_70;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_68;
  time_point now;
  error_code local_58;
  undefined8 local_48;
  unsigned_long local_40;
  unsigned_long local_38;
  int local_30;
  int local_2c;
  int msg_local;
  int length_local;
  ut_pex_peer_plugin *this_local;
  span<const_char> body_local;
  
  body_local.m_ptr = (char *)body.m_len;
  this_local = (ut_pex_peer_plugin *)body.m_ptr;
  if (msg == 1) {
    if (this->m_message_index == 0) {
      body_local.m_len._7_1_ = 0;
    }
    else {
      local_30 = msg;
      local_2c = length;
      _msg_local = this;
      local_40 = (unsigned_long)libtorrent::aux::torrent::flags(this->m_torrent);
      local_48 = 0x200000;
      local_38 = (unsigned_long)
                 libtorrent::flags::operator&
                           ((bitfield_flag<unsigned_long,_libtorrent::torrent_flags_tag,_void>)
                            local_40,(bitfield_flag<unsigned_long,_libtorrent::torrent_flags_tag,_void>
                                      )0x200000);
      bVar2 = libtorrent::flags::bitfield_flag::operator_cast_to_bool((bitfield_flag *)&local_38);
      if (bVar2) {
        body_local.m_len._7_1_ = 1;
      }
      else if (local_2c < 0x7d001) {
        iVar6 = span<const_char>::size((span<const_char> *)&this_local);
        if ((int)iVar6 < local_2c) {
          body_local.m_len._7_1_ = 1;
        }
        else {
          local_68.__d.__r = (duration)libtorrent::aux::time_now();
          local_7c = 0x3c;
          ::std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
                    ((duration<long,std::ratio<1l,1l>> *)&local_78,&local_7c);
          local_70 = ::std::chrono::operator-(&local_68,&local_78);
          bVar2 = ::std::chrono::operator<(&local_70,this->m_last_pex);
          if (bVar2) {
            ppVar1 = this->m_pc;
            boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                      ((error_code *)&num_pex_timers,too_frequent_pex,(type *)0x0);
            (*(ppVar1->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])
                      (ppVar1,&num_pex_timers,1,0);
            body_local.m_len._7_1_ = 1;
          }
          else {
            for (pex_msg._60_4_ = 0; (int)pex_msg._60_4_ < 5; pex_msg._60_4_ = pex_msg._60_4_ + 1) {
              this->m_last_pex[(int)pex_msg._60_4_].__d.__r =
                   this->m_last_pex[pex_msg._60_4_ + 1].__d.__r;
            }
            this->m_last_pex[5].__d.__r = (rep)local_68.__d.__r;
            bdecode_node::bdecode_node((bdecode_node *)&ec.cat_);
            boost::system::error_code::error_code((error_code *)local_f0);
            start = span<const_char>::begin((span<const_char> *)&this_local);
            end = span<const_char>::end((span<const_char> *)&this_local);
            local_f4 = bdecode(start,end,(bdecode_node *)&ec.cat_,(error_code *)local_f0,(int *)0x0,
                               100,2000000);
            if ((local_f4 == 0) &&
               (tVar3 = bdecode_node::type((bdecode_node *)&ec.cat_), tVar3 == dict_t)) {
              ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)&num_added,"dropped");
              bdecode_node::dict_find_string
                        ((bdecode_node *)local_160,(bdecode_node *)&ec.cat_,_num_added);
              num_peers = 0;
              local_178 = 0;
              bVar2 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_160);
              if (bVar2) {
                iVar4 = bdecode_node::string_length((bdecode_node *)local_160);
                num_peers = iVar4 / 6;
              }
              bVar2 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_160);
              if (bVar2) {
                iVar4 = bdecode_node::string_length((bdecode_node *)local_160);
                register0x00000000 = bdecode_node::string_ptr((bdecode_node *)local_160);
                ppcVar11 = extraout_RDX;
                for (adr.impl_.data_._20_4_ = 0; (int)adr.impl_.data_._20_4_ < iVar4 / 6;
                    adr.impl_.data_._20_4_ = adr.impl_.data_._20_4_ + 1) {
                  libtorrent::aux::
                  read_v4_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,char_const*&>
                            ((basic_endpoint<boost::asio::ip::tcp> *)local_1a8,
                             (aux *)((long)&adr.impl_.data_ + 0x18),ppcVar11);
                  boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address
                            (&local_1d8,(basic_endpoint<boost::asio::ip::tcp> *)local_1a8);
                  boost::asio::ip::address::to_v4((address *)local_1b8);
                  local_1b8._6_4_ = boost::asio::ip::address_v4::to_bytes((address_v4 *)local_1b8);
                  j._M_current._6_2_ =
                       boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::port
                                 ((basic_endpoint<boost::asio::ip::tcp> *)local_1a8);
                  ::std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>::
                  pair<std::array<unsigned_char,_4UL>,_unsigned_short,_true>
                            ((pair<std::array<unsigned_char,_4UL>,_unsigned_short> *)
                             (local_1b8 + 10),(array<unsigned_char,_4UL> *)(local_1b8 + 6),
                             (unsigned_short *)((long)&j._M_current + 6));
                  ppVar12 = &(this->super_ut_pex_peer_store).m_peers;
                  local_1f0._M_current =
                       (pair<std::array<unsigned_char,_4UL>,_unsigned_short> *)
                       ::std::
                       vector<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>_>_>
                       ::begin(ppVar12);
                  local_1f8 = (pair<std::array<unsigned_char,_4UL>,_unsigned_short> *)
                              ::std::
                              vector<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>_>_>
                              ::end(ppVar12);
                  local_1e8 = ::std::
                              lower_bound<__gnu_cxx::__normal_iterator<std::pair<std::array<unsigned_char,4ul>,unsigned_short>*,std::vector<std::pair<std::array<unsigned_char,4ul>,unsigned_short>,std::allocator<std::pair<std::array<unsigned_char,4ul>,unsigned_short>>>>,std::pair<std::array<unsigned_char,4ul>,unsigned_short>>
                                        (local_1f0,
                                         (__normal_iterator<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>_*,_std::vector<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>_>_>_>
                                          )local_1f8,
                                         (pair<std::array<unsigned_char,_4UL>,_unsigned_short> *)
                                         (local_1b8 + 10));
                  local_200._M_current =
                       (pair<std::array<unsigned_char,_4UL>,_unsigned_short> *)
                       ::std::
                       vector<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>_>_>
                       ::end(&(this->super_ut_pex_peer_store).m_peers);
                  bVar2 = __gnu_cxx::operator!=(&local_1e8,&local_200);
                  local_6f1 = false;
                  ppcVar11 = extraout_RDX_00;
                  if (bVar2) {
                    ppVar7 = __gnu_cxx::
                             __normal_iterator<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>_*,_std::vector<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>_>_>_>
                             ::operator*(&local_1e8);
                    local_6f1 = ::std::operator==(ppVar7,(
                                                  pair<std::array<unsigned_char,_4UL>,_unsigned_short>
                                                  *)(local_1b8 + 10));
                    ppcVar11 = extraout_RDX_01;
                  }
                  if (local_6f1 != false) {
                    __gnu_cxx::
                    __normal_iterator<std::pair<std::array<unsigned_char,4ul>,unsigned_short>const*,std::vector<std::pair<std::array<unsigned_char,4ul>,unsigned_short>,std::allocator<std::pair<std::array<unsigned_char,4ul>,unsigned_short>>>>
                    ::__normal_iterator<std::pair<std::array<unsigned_char,4ul>,unsigned_short>*>
                              ((__normal_iterator<std::pair<std::array<unsigned_char,4ul>,unsigned_short>const*,std::vector<std::pair<std::array<unsigned_char,4ul>,unsigned_short>,std::allocator<std::pair<std::array<unsigned_char,4ul>,unsigned_short>>>>
                                *)&local_208,&local_1e8);
                    local_210 = (pair<std::array<unsigned_char,_4UL>,_unsigned_short> *)
                                ::std::
                                vector<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>_>_>
                                ::erase(&(this->super_ut_pex_peer_store).m_peers,local_208);
                    ppcVar11 = extraout_RDX_02;
                  }
                }
              }
              ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)&pf.m_size,"added");
              bdecode_node::dict_find_string
                        (&local_250,(bdecode_node *)&ec.cat_,stack0xfffffffffffffda0);
              bdecode_node::operator=((bdecode_node *)local_160,&local_250);
              bdecode_node::~bdecode_node(&local_250);
              ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)&num_peers_1,"added.f")
              ;
              bdecode_node::dict_find_string
                        ((bdecode_node *)local_2a0,(bdecode_node *)&ec.cat_,_num_peers_1);
              in_1._7_1_ = 0;
              bVar2 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_160);
              if (bVar2) {
                iVar4 = bdecode_node::string_length((bdecode_node *)local_160);
                local_178 = iVar4 / 6;
              }
              bVar2 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_160);
              if ((bVar2) &&
                 (bVar2 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_2a0), bVar2)) {
                iVar4 = bdecode_node::string_length((bdecode_node *)local_2a0);
                iVar5 = bdecode_node::string_length((bdecode_node *)local_160);
                if (iVar4 == iVar5 / 6) {
                  in_1._0_4_ = bdecode_node::string_length((bdecode_node *)local_2a0);
                  fin = bdecode_node::string_ptr((bdecode_node *)local_160);
                  register0x00000000 = (uchar *)bdecode_node::string_ptr((bdecode_node *)local_2a0);
                  ppcVar11 = extraout_RDX_03;
                  for (adr_1.impl_.data_._20_4_ = 0; (int)adr_1.impl_.data_._20_4_ < (int)in_1;
                      adr_1.impl_.data_._20_4_ = adr_1.impl_.data_._20_4_ + 1) {
                    libtorrent::aux::
                    read_v4_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,char_const*&>
                              ((basic_endpoint<boost::asio::ip::tcp> *)local_2e8,(aux *)&fin,
                               ppcVar11);
                    libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::pex_flags_tag,_void>
                    ::bitfield_flag(&local_2e9,*stack0xfffffffffffffd38);
                    local_2ea = (uchar)libtorrent::flags::
                                       bitfield_flag<unsigned_char,_libtorrent::pex_flags_tag,_void>
                                       ::operator~((
                                                  bitfield_flag<unsigned_char,_libtorrent::pex_flags_tag,_void>
                                                  *)&pex_lt_v2);
                    libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::pex_flags_tag,_void>
                    ::operator&=(&local_2e9,
                                 (bitfield_flag<unsigned_char,_libtorrent::pex_flags_tag,_void>)
                                 local_2ea);
                    sVar8 = ::std::
                            vector<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>_>_>
                            ::size(&(this->super_ut_pex_peer_store).m_peers);
                    psVar9 = libtorrent::aux::torrent::settings(this->m_torrent);
                    iVar4 = libtorrent::aux::session_settings::get_int(psVar9,0x404b);
                    if (iVar4 <= (int)sVar8) break;
                    boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address
                              (&local_310,(basic_endpoint<boost::asio::ip::tcp> *)local_2e8);
                    bVar2 = libtorrent::aux::is_local(&local_310);
                    local_759 = 0;
                    ppcVar11 = extraout_RDX_04;
                    if (bVar2) {
                      iVar4 = (*(this->m_pc->super_bandwidth_socket)._vptr_bandwidth_socket[0x10])()
                      ;
                      boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address
                                ((address *)local_330,
                                 (basic_endpoint<boost::asio::ip::tcp> *)
                                 CONCAT44(extraout_var,iVar4));
                      bVar2 = libtorrent::aux::is_local((address *)local_330);
                      local_759 = bVar2 ^ 0xff;
                      ppcVar11 = extraout_RDX_05;
                    }
                    if ((local_759 & 1) == 0) {
                      boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address
                                (&local_360,(basic_endpoint<boost::asio::ip::tcp> *)local_2e8);
                      boost::asio::ip::address::to_v4((address *)local_340);
                      local_340._6_4_ =
                           boost::asio::ip::address_v4::to_bytes((address_v4 *)local_340);
                      j_1._M_current._6_2_ =
                           boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::port
                                     ((basic_endpoint<boost::asio::ip::tcp> *)local_2e8);
                      ::std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>::
                      pair<std::array<unsigned_char,_4UL>,_unsigned_short,_true>
                                ((pair<std::array<unsigned_char,_4UL>,_unsigned_short> *)
                                 (local_340 + 10),(array<unsigned_char,_4UL> *)(local_340 + 6),
                                 (unsigned_short *)((long)&j_1._M_current + 6));
                      ppVar12 = &(this->super_ut_pex_peer_store).m_peers;
                      local_378._M_current =
                           (pair<std::array<unsigned_char,_4UL>,_unsigned_short> *)
                           ::std::
                           vector<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>_>_>
                           ::begin(ppVar12);
                      local_380 = (pair<std::array<unsigned_char,_4UL>,_unsigned_short> *)
                                  ::std::
                                  vector<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>_>_>
                                  ::end(ppVar12);
                      local_370 = ::std::
                                  lower_bound<__gnu_cxx::__normal_iterator<std::pair<std::array<unsigned_char,4ul>,unsigned_short>*,std::vector<std::pair<std::array<unsigned_char,4ul>,unsigned_short>,std::allocator<std::pair<std::array<unsigned_char,4ul>,unsigned_short>>>>,std::pair<std::array<unsigned_char,4ul>,unsigned_short>>
                                            (local_378,
                                             (__normal_iterator<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>_*,_std::vector<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>_>_>_>
                                              )local_380,
                                             (pair<std::array<unsigned_char,_4UL>,_unsigned_short> *
                                             )(local_340 + 10));
                      local_388._M_current =
                           (pair<std::array<unsigned_char,_4UL>,_unsigned_short> *)
                           ::std::
                           vector<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>_>_>
                           ::end(&(this->super_ut_pex_peer_store).m_peers);
                      bVar2 = __gnu_cxx::operator!=(&local_370,&local_388);
                      local_791 = false;
                      ppcVar11 = extraout_RDX_06;
                      if (bVar2) {
                        ppVar7 = __gnu_cxx::
                                 __normal_iterator<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>_*,_std::vector<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>_>_>_>
                                 ::operator*(&local_370);
                        local_791 = ::std::operator==(ppVar7,(
                                                  pair<std::array<unsigned_char,_4UL>,_unsigned_short>
                                                  *)(local_340 + 10));
                        ppcVar11 = extraout_RDX_07;
                      }
                      if (local_791 == false) {
                        __gnu_cxx::
                        __normal_iterator<std::pair<std::array<unsigned_char,4ul>,unsigned_short>const*,std::vector<std::pair<std::array<unsigned_char,4ul>,unsigned_short>,std::allocator<std::pair<std::array<unsigned_char,4ul>,unsigned_short>>>>
                        ::
                        __normal_iterator<std::pair<std::array<unsigned_char,4ul>,unsigned_short>*>
                                  ((__normal_iterator<std::pair<std::array<unsigned_char,4ul>,unsigned_short>const*,std::vector<std::pair<std::array<unsigned_char,4ul>,unsigned_short>,std::allocator<std::pair<std::array<unsigned_char,4ul>,unsigned_short>>>>
                                    *)&local_390,&local_370);
                        ::std::
                        vector<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>_>_>
                        ::insert(&(this->super_ut_pex_peer_store).m_peers,local_390,
                                 (value_type *)(local_340 + 10));
                        p6._63_1_ = 4;
                        p6._62_1_ = local_2e9.m_val;
                        libtorrent::aux::torrent::add_peer
                                  (this->m_torrent,(endpoint *)local_2e8,(peer_source_flags_t)0x4,
                                   local_2e9);
                        in_1._7_1_ = 1;
                        ppcVar11 = extraout_RDX_08;
                      }
                    }
                    unique0x10001764 = stack0xfffffffffffffd38 + 1;
                  }
                }
              }
              ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)auStack_3f0,"dropped6")
              ;
              bdecode_node::dict_find_string
                        ((bdecode_node *)local_3e0,(bdecode_node *)&ec.cat_,_auStack_3f0);
              bVar2 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_3e0);
              if (bVar2) {
                iVar4 = bdecode_node::string_length((bdecode_node *)local_3e0);
                num_peers = num_peers + iVar4 / 0x12;
                iVar4 = bdecode_node::string_length((bdecode_node *)local_3e0);
                register0x00000000 = bdecode_node::string_ptr((bdecode_node *)local_3e0);
                ppcVar11 = extraout_RDX_09;
                for (adr_2.impl_.data_._20_4_ = 0; (int)adr_2.impl_.data_._20_4_ < iVar4 / 0x12;
                    adr_2.impl_.data_._20_4_ = adr_2.impl_.data_._20_4_ + 1) {
                  libtorrent::aux::
                  read_v6_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,char_const*&>
                            ((basic_endpoint<boost::asio::ip::tcp> *)(v_2.first._M_elems + 10),
                             (aux *)((long)&adr_2.impl_.data_ + 0x18),ppcVar11);
                  boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address
                            (&local_480,
                             (basic_endpoint<boost::asio::ip::tcp> *)(v_2.first._M_elems + 10));
                  boost::asio::ip::address::to_v6(&local_460,&local_480);
                  local_442._M_elems = (_Type)boost::asio::ip::address_v6::to_bytes(&local_460);
                  j_2._M_current._6_2_ =
                       boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::port
                                 ((basic_endpoint<boost::asio::ip::tcp> *)(v_2.first._M_elems + 10))
                  ;
                  ::std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>::
                  pair<std::array<unsigned_char,_16UL>,_unsigned_short,_true>
                            ((pair<std::array<unsigned_char,_16UL>,_unsigned_short> *)local_432,
                             &local_442,(unsigned_short *)((long)&j_2._M_current + 6));
                  ppVar13 = &(this->super_ut_pex_peer_store).m_peers6;
                  local_498._M_current =
                       (pair<std::array<unsigned_char,_16UL>,_unsigned_short> *)
                       ::std::
                       vector<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>_>_>
                       ::begin(ppVar13);
                  local_4a0 = (pair<std::array<unsigned_char,_16UL>,_unsigned_short> *)
                              ::std::
                              vector<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>_>_>
                              ::end(ppVar13);
                  local_490 = ::std::
                              lower_bound<__gnu_cxx::__normal_iterator<std::pair<std::array<unsigned_char,16ul>,unsigned_short>*,std::vector<std::pair<std::array<unsigned_char,16ul>,unsigned_short>,std::allocator<std::pair<std::array<unsigned_char,16ul>,unsigned_short>>>>,std::pair<std::array<unsigned_char,16ul>,unsigned_short>>
                                        (local_498,
                                         (__normal_iterator<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>_*,_std::vector<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>_>_>_>
                                          )local_4a0,
                                         (pair<std::array<unsigned_char,_16UL>,_unsigned_short> *)
                                         local_432);
                  local_4a8._M_current =
                       (pair<std::array<unsigned_char,_16UL>,_unsigned_short> *)
                       ::std::
                       vector<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>_>_>
                       ::end(&(this->super_ut_pex_peer_store).m_peers6);
                  bVar2 = __gnu_cxx::operator!=(&local_490,&local_4a8);
                  local_7d1 = false;
                  ppcVar11 = extraout_RDX_10;
                  if (bVar2) {
                    ppVar10 = __gnu_cxx::
                              __normal_iterator<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>_*,_std::vector<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>_>_>_>
                              ::operator*(&local_490);
                    local_7d1 = ::std::operator==(ppVar10,(
                                                  pair<std::array<unsigned_char,_16UL>,_unsigned_short>
                                                  *)local_432);
                    ppcVar11 = extraout_RDX_11;
                  }
                  if (local_7d1 != false) {
                    __gnu_cxx::
                    __normal_iterator<std::pair<std::array<unsigned_char,16ul>,unsigned_short>const*,std::vector<std::pair<std::array<unsigned_char,16ul>,unsigned_short>,std::allocator<std::pair<std::array<unsigned_char,16ul>,unsigned_short>>>>
                    ::__normal_iterator<std::pair<std::array<unsigned_char,16ul>,unsigned_short>*>
                              ((__normal_iterator<std::pair<std::array<unsigned_char,16ul>,unsigned_short>const*,std::vector<std::pair<std::array<unsigned_char,16ul>,unsigned_short>,std::allocator<std::pair<std::array<unsigned_char,16ul>,unsigned_short>>>>
                                *)&local_4b0,&local_490);
                    local_4b8 = (pair<std::array<unsigned_char,_16UL>,_unsigned_short> *)
                                ::std::
                                vector<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>_>_>
                                ::erase(&(this->super_ut_pex_peer_store).m_peers6,local_4b0);
                    ppcVar11 = extraout_RDX_12;
                  }
                }
              }
              ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)&p6f.m_size,"added6");
              bdecode_node::dict_find_string
                        (&local_4f8,(bdecode_node *)&ec.cat_,stack0xfffffffffffffaf8);
              bdecode_node::operator=((bdecode_node *)local_3e0,&local_4f8);
              bdecode_node::~bdecode_node(&local_4f8);
              bVar2 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_3e0);
              if (bVar2) {
                iVar4 = bdecode_node::string_length((bdecode_node *)local_3e0);
                local_178 = iVar4 / 0x12 + local_178;
              }
              ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)auStack_558,"added6.f")
              ;
              bdecode_node::dict_find_string
                        ((bdecode_node *)local_548,(bdecode_node *)&ec.cat_,_auStack_558);
              bVar2 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_3e0);
              if ((bVar2) &&
                 (bVar2 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_548), bVar2)) {
                iVar4 = bdecode_node::string_length((bdecode_node *)local_548);
                iVar5 = bdecode_node::string_length((bdecode_node *)local_3e0);
                if (iVar4 == iVar5 / 0x12) {
                  in_3._4_4_ = bdecode_node::string_length((bdecode_node *)local_548);
                  fin_1 = bdecode_node::string_ptr((bdecode_node *)local_3e0);
                  register0x00000000 = (uchar *)bdecode_node::string_ptr((bdecode_node *)local_548);
                  ppcVar11 = extraout_RDX_13;
                  for (adr_3.impl_.data_._20_4_ = 0; (int)adr_3.impl_.data_._20_4_ < in_3._4_4_;
                      adr_3.impl_.data_._20_4_ = adr_3.impl_.data_._20_4_ + 1) {
                    libtorrent::aux::
                    read_v6_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,char_const*&>
                              ((basic_endpoint<boost::asio::ip::tcp> *)local_590,(aux *)&fin_1,
                               ppcVar11);
                    libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::pex_flags_tag,_void>
                    ::bitfield_flag(&local_591,*stack0xfffffffffffffa90);
                    local_592 = (uchar)libtorrent::flags::
                                       bitfield_flag<unsigned_char,_libtorrent::pex_flags_tag,_void>
                                       ::operator~((
                                                  bitfield_flag<unsigned_char,_libtorrent::pex_flags_tag,_void>
                                                  *)&pex_lt_v2);
                    libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::pex_flags_tag,_void>
                    ::operator&=(&local_591,
                                 (bitfield_flag<unsigned_char,_libtorrent::pex_flags_tag,_void>)
                                 local_592);
                    boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address
                              (&local_5b8,(basic_endpoint<boost::asio::ip::tcp> *)local_590);
                    bVar2 = libtorrent::aux::is_local(&local_5b8);
                    local_821 = 0;
                    ppcVar11 = extraout_RDX_14;
                    if (bVar2) {
                      iVar4 = (*(this->m_pc->super_bandwidth_socket)._vptr_bandwidth_socket[0x10])()
                      ;
                      __return_storage_ptr__ = (address *)(v_3.first._M_elems + 10);
                      boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address
                                (__return_storage_ptr__,
                                 (basic_endpoint<boost::asio::ip::tcp> *)
                                 CONCAT44(extraout_var_00,iVar4));
                      bVar2 = libtorrent::aux::is_local(__return_storage_ptr__);
                      local_821 = bVar2 ^ 0xff;
                      ppcVar11 = extraout_RDX_15;
                    }
                    if ((local_821 & 1) == 0) {
                      sVar8 = ::std::
                              vector<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>_>_>
                              ::size(&(this->super_ut_pex_peer_store).m_peers6);
                      psVar9 = libtorrent::aux::torrent::settings(this->m_torrent);
                      iVar4 = libtorrent::aux::session_settings::get_int(psVar9,0x404b);
                      if (iVar4 <= (int)sVar8) break;
                      boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address
                                (&local_638,(basic_endpoint<boost::asio::ip::tcp> *)local_590);
                      boost::asio::ip::address::to_v6(&local_618,&local_638);
                      local_5fa._M_elems = (_Type)boost::asio::ip::address_v6::to_bytes(&local_618);
                      j_3._M_current._6_2_ =
                           boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::port
                                     ((basic_endpoint<boost::asio::ip::tcp> *)local_590);
                      ::std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>::
                      pair<std::array<unsigned_char,_16UL>,_unsigned_short,_true>
                                ((pair<std::array<unsigned_char,_16UL>,_unsigned_short> *)local_5ea,
                                 &local_5fa,(unsigned_short *)((long)&j_3._M_current + 6));
                      ppVar13 = &(this->super_ut_pex_peer_store).m_peers6;
                      local_650._M_current =
                           (pair<std::array<unsigned_char,_16UL>,_unsigned_short> *)
                           ::std::
                           vector<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>_>_>
                           ::begin(ppVar13);
                      local_658 = (pair<std::array<unsigned_char,_16UL>,_unsigned_short> *)
                                  ::std::
                                  vector<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>_>_>
                                  ::end(ppVar13);
                      local_648 = ::std::
                                  lower_bound<__gnu_cxx::__normal_iterator<std::pair<std::array<unsigned_char,16ul>,unsigned_short>*,std::vector<std::pair<std::array<unsigned_char,16ul>,unsigned_short>,std::allocator<std::pair<std::array<unsigned_char,16ul>,unsigned_short>>>>,std::pair<std::array<unsigned_char,16ul>,unsigned_short>>
                                            (local_650,
                                             (__normal_iterator<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>_*,_std::vector<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>_>_>_>
                                              )local_658,
                                             (pair<std::array<unsigned_char,_16UL>,_unsigned_short>
                                              *)local_5ea);
                      local_660._M_current =
                           (pair<std::array<unsigned_char,_16UL>,_unsigned_short> *)
                           ::std::
                           vector<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>_>_>
                           ::end(&(this->super_ut_pex_peer_store).m_peers6);
                      bVar2 = __gnu_cxx::operator!=(&local_648,&local_660);
                      local_869 = false;
                      ppcVar11 = extraout_RDX_16;
                      if (bVar2) {
                        ppVar10 = __gnu_cxx::
                                  __normal_iterator<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>_*,_std::vector<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>_>_>_>
                                  ::operator*(&local_648);
                        local_869 = ::std::operator==(ppVar10,(
                                                  pair<std::array<unsigned_char,_16UL>,_unsigned_short>
                                                  *)local_5ea);
                        ppcVar11 = extraout_RDX_17;
                      }
                      if (local_869 == false) {
                        __gnu_cxx::
                        __normal_iterator<std::pair<std::array<unsigned_char,16ul>,unsigned_short>const*,std::vector<std::pair<std::array<unsigned_char,16ul>,unsigned_short>,std::allocator<std::pair<std::array<unsigned_char,16ul>,unsigned_short>>>>
                        ::
                        __normal_iterator<std::pair<std::array<unsigned_char,16ul>,unsigned_short>*>
                                  ((__normal_iterator<std::pair<std::array<unsigned_char,16ul>,unsigned_short>const*,std::vector<std::pair<std::array<unsigned_char,16ul>,unsigned_short>,std::allocator<std::pair<std::array<unsigned_char,16ul>,unsigned_short>>>>
                                    *)&local_668,&local_648);
                        ::std::
                        vector<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>_>_>
                        ::insert(&(this->super_ut_pex_peer_store).m_peers6,local_668,
                                 (value_type *)local_5ea);
                        libtorrent::aux::torrent::add_peer
                                  (this->m_torrent,(endpoint *)local_590,(peer_source_flags_t)0x4,
                                   local_591);
                        in_1._7_1_ = 1;
                        ppcVar11 = extraout_RDX_18;
                      }
                    }
                    unique0x10001754 = stack0xfffffffffffffa90 + 1;
                  }
                }
              }
              libtorrent::aux::peer_connection::peer_log
                        (this->m_pc,incoming_message,"PEX","dropped: %d added: %d",
                         (ulong)(uint)num_peers,(ulong)local_178);
              this_00 = libtorrent::aux::peer_connection::stats_counters(this->m_pc);
              counters::inc_stats_counter(this_00,0x52,1);
              if ((in_1._7_1_ & 1) != 0) {
                libtorrent::aux::torrent::do_connect_boost(this->m_torrent);
              }
              body_local.m_len._7_1_ = 1;
              p.m_size = 1;
              bdecode_node::~bdecode_node((bdecode_node *)local_548);
              bdecode_node::~bdecode_node((bdecode_node *)local_3e0);
              bdecode_node::~bdecode_node((bdecode_node *)local_2a0);
              bdecode_node::~bdecode_node((bdecode_node *)local_160);
            }
            else {
              ppVar1 = this->m_pc;
              boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                        (local_118,invalid_pex_message,(type *)0x0);
              p._63_1_ = 2;
              (*(ppVar1->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])(ppVar1,local_118,1,2)
              ;
              body_local.m_len._7_1_ = 1;
              p.m_size = 1;
            }
            bdecode_node::~bdecode_node((bdecode_node *)&ec.cat_);
          }
        }
      }
      else {
        ppVar1 = this->m_pc;
        boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                  (&local_58,pex_message_too_large,(type *)0x0);
        now.__d.__r._7_1_ = 2;
        (*(ppVar1->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])(ppVar1,&local_58,1,2);
        body_local.m_len._7_1_ = 1;
      }
    }
  }
  else {
    body_local.m_len._7_1_ = 0;
  }
  return (bool)(body_local.m_len._7_1_ & 1);
}

Assistant:

bool on_extended(int const length, int const msg, span<char const> body) override
		{
			if (msg != extension_index) return false;
			if (m_message_index == 0) return false;

			if (m_torrent.flags() & torrent_flags::disable_pex) return true;

			if (length > 500 * 1024)
			{
				m_pc.disconnect(errors::pex_message_too_large, operation_t::bittorrent, peer_connection_interface::peer_error);
				return true;
			}

			if (int(body.size()) < length) return true;

			time_point const now = aux::time_now();
			if (now - seconds(60) <  m_last_pex[0])
			{
				// this client appears to be trying to flood us
				// with pex messages. Don't allow that.
				m_pc.disconnect(errors::too_frequent_pex, operation_t::bittorrent);
				return true;
			}

			int const num_pex_timers = sizeof(m_last_pex) / sizeof(m_last_pex[0]);
			for (int i = 0; i < num_pex_timers - 1; ++i)
				m_last_pex[i] = m_last_pex[i + 1];
			m_last_pex[num_pex_timers - 1] = now;

			bdecode_node pex_msg;
			error_code ec;
			int const ret = bdecode(body.begin(), body.end(), pex_msg, ec);
			if (ret != 0 || pex_msg.type() != bdecode_node::dict_t)
			{
				m_pc.disconnect(errors::invalid_pex_message, operation_t::bittorrent, peer_connection_interface::peer_error);
				return true;
			}

			bdecode_node p = pex_msg.dict_find_string("dropped");

#ifndef TORRENT_DISABLE_LOGGING
			int num_dropped = 0;
			int num_added = 0;
			if (p) num_dropped += p.string_length() / 6;
#endif
			if (p)
			{
				int const num_peers = p.string_length() / 6;
				char const* in = p.string_ptr();

				for (int i = 0; i < num_peers; ++i)
				{
					auto const adr = aux::read_v4_endpoint<tcp::endpoint>(in);
					peers4_t::value_type const v(adr.address().to_v4().to_bytes(), adr.port());
					auto const j = std::lower_bound(m_peers.begin(), m_peers.end(), v);
					if (j != m_peers.end() && *j == v) m_peers.erase(j);
				}
			}

			p = pex_msg.dict_find_string("added");
			bdecode_node const pf = pex_msg.dict_find_string("added.f");

			bool peers_added = false;
#ifndef TORRENT_DISABLE_LOGGING
			if (p) num_added += p.string_length() / 6;
#endif
			if (p && pf && pf.string_length() == p.string_length() / 6)
			{
				int const num_peers = pf.string_length();
				char const* in = p.string_ptr();
				char const* fin = pf.string_ptr();

				for (int i = 0; i < num_peers; ++i)
				{
					auto const adr = aux::read_v4_endpoint<tcp::endpoint>(in);
					pex_flags_t flags(static_cast<std::uint8_t>(*fin++));

					// this is an internal flag. disregard it from the internet
					flags &= ~pex_lt_v2;

					if (int(m_peers.size()) >= m_torrent.settings().get_int(settings_pack::max_pex_peers))
						break;

					// ignore local addresses unless the peer is local to us
					if (aux::is_local(adr.address()) && !aux::is_local(m_pc.remote().address())) continue;

					peers4_t::value_type const v(adr.address().to_v4().to_bytes(), adr.port());
					auto const j = std::lower_bound(m_peers.begin(), m_peers.end(), v);
					// do we already know about this peer?
					if (j != m_peers.end() && *j == v) continue;
					m_peers.insert(j, v);
					m_torrent.add_peer(adr, peer_info::pex, flags);
					peers_added = true;
				}
			}

			bdecode_node p6 = pex_msg.dict_find_string("dropped6");
			if (p6)
			{
#ifndef TORRENT_DISABLE_LOGGING
				num_dropped += p6.string_length() / 18;
#endif
				int const num_peers = p6.string_length() / 18;
				char const* in = p6.string_ptr();

				for (int i = 0; i < num_peers; ++i)
				{
					auto const adr = aux::read_v6_endpoint<tcp::endpoint>(in);
					peers6_t::value_type const v(adr.address().to_v6().to_bytes(), adr.port());
					auto const j = std::lower_bound(m_peers6.begin(), m_peers6.end(), v);
					if (j != m_peers6.end() && *j == v) m_peers6.erase(j);
				}
			}

			p6 = pex_msg.dict_find_string("added6");
#ifndef TORRENT_DISABLE_LOGGING
			if (p6) num_added += p6.string_length() / 18;
#endif
			bdecode_node const p6f = pex_msg.dict_find_string("added6.f");
			if (p6 && p6f && p6f.string_length() == p6.string_length() / 18)
			{
				int const num_peers = p6f.string_length();
				char const* in = p6.string_ptr();
				char const* fin = p6f.string_ptr();

				for (int i = 0; i < num_peers; ++i)
				{
					auto const adr = aux::read_v6_endpoint<tcp::endpoint>(in);
					pex_flags_t flags(static_cast<std::uint8_t>(*fin++));

					// this is an internal flag. disregard it from the internet
					flags &= ~pex_lt_v2;

					// ignore local addresses unless the peer is local to us
					if (aux::is_local(adr.address()) && !aux::is_local(m_pc.remote().address())) continue;
					if (int(m_peers6.size()) >= m_torrent.settings().get_int(settings_pack::max_pex_peers))
						break;

					peers6_t::value_type const v(adr.address().to_v6().to_bytes(), adr.port());
					auto const j = std::lower_bound(m_peers6.begin(), m_peers6.end(), v);
					// do we already know about this peer?
					if (j != m_peers6.end() && *j == v) continue;
					m_peers6.insert(j, v);
					m_torrent.add_peer(adr, peer_info::pex, flags);
					peers_added = true;
				}
			}
#ifndef TORRENT_DISABLE_LOGGING
			m_pc.peer_log(peer_log_alert::incoming_message, "PEX", "dropped: %d added: %d"
				, num_dropped, num_added);
#endif

			m_pc.stats_counters().inc_stats_counter(counters::num_incoming_pex);

			if (peers_added) m_torrent.do_connect_boost();
			return true;
		}